

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O2

ngram_model_t * ngram_model_set_select(ngram_model_t *base,char *name)

{
  uint uVar1;
  int iVar2;
  ngram_model_t *pnVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = base[1].refcount;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  do {
    if (uVar5 == uVar4) {
LAB_0012ea03:
      if ((uint)uVar5 == uVar1) {
        pnVar3 = (ngram_model_t *)0x0;
      }
      else {
        *(uint *)&base[1].field_0x4 = (uint)uVar5;
        pnVar3 = *(ngram_model_t **)(base[1].n_counts + uVar5 * 2);
      }
      return pnVar3;
    }
    iVar2 = strcmp(*(char **)(*(long *)&base[1].n_1g_alloc + uVar4 * 8),name);
    if (iVar2 == 0) {
      uVar5 = uVar4 & 0xffffffff;
      goto LAB_0012ea03;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

ngram_model_t *
ngram_model_set_select(ngram_model_t * base, const char *name)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 i;

    /* There probably won't be very many submodels. */
    for (i = 0; i < set->n_models; ++i)
        if (0 == strcmp(set->names[i], name))
            break;
    if (i == set->n_models)
        return NULL;
    set->cur = i;
    return set->lms[set->cur];
}